

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableStruct.cpp
# Opt level: O0

void __thiscall
adios2::core::StructDefinition::AddField
          (StructDefinition *this,string *name,size_t offset,DataType type,size_t elementcount)

{
  size_t sVar1;
  size_t sVar2;
  reference this_00;
  DataType in_ECX;
  size_t in_RDX;
  string *in_RSI;
  long in_RDI;
  size_t in_R8;
  value_type *d;
  allocator *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffdb0;
  allocator *paVar3;
  int commRank;
  string *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffdd0;
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [4];
  DataType in_stack_fffffffffffffe6c;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  undefined1 local_d1 [40];
  undefined1 local_a9 [40];
  undefined1 local_81 [56];
  undefined1 local_49 [33];
  size_t local_28;
  DataType local_1c;
  size_t local_18;
  string *local_10;
  
  commRank = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 0x18) & 1) != 0) {
    in_stack_fffffffffffffdd0 = (string *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_49 + 1),"core",(allocator *)in_stack_fffffffffffffdd0);
    in_stack_fffffffffffffdc8 = (string *)local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_81 + 1),"VariableStruct::StructDefinition",
               (allocator *)in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffdc0 = (string *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_a9 + 1),"AddField",(allocator *)in_stack_fffffffffffffdc0);
    in_stack_fffffffffffffdb8 = (string *)local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_d1 + 1),"struct definition already frozen",
               (allocator *)in_stack_fffffffffffffdb8);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8,commRank);
    std::__cxx11::string::~string((string *)(local_d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d1);
    std::__cxx11::string::~string((string *)(local_a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a9);
    std::__cxx11::string::~string((string *)(local_81 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_81);
    std::__cxx11::string::~string((string *)(local_49 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_49);
  }
  if ((local_1c == None) || (local_1c == Struct)) {
    paVar3 = &local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"core",paVar3);
    commRank = (int)((ulong)paVar3 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"VariableStruct::StructDefinition",&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"AddField",&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,"invalid data type",&local_171);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8,commRank);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  sVar1 = local_18;
  sVar2 = helper::GetDataTypeSize(in_stack_fffffffffffffe6c);
  if (*(ulong *)(in_RDI + 0x40) < sVar1 + sVar2 * local_28) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"core",&local_199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,"VariableStruct::StructDefinition",&local_1c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"AddField",&local_1e9);
    in_stack_fffffffffffffd70 = &local_211;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,"exceeded struct size",in_stack_fffffffffffffd70);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8,commRank);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
  }
  std::
  vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
  ::emplace_back<>((vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                    *)in_stack_fffffffffffffd70);
  this_00 = std::
            vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
            ::back((vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                    *)in_stack_fffffffffffffd70);
  std::__cxx11::string::operator=((string *)this_00,local_10);
  this_00->Offset = local_18;
  this_00->Type = local_1c;
  this_00->ElementCount = local_28;
  return;
}

Assistant:

void StructDefinition::AddField(const std::string &name, const size_t offset, const DataType type,
                                const size_t elementcount)
{
    if (m_Frozen)
    {
        helper::Throw<std::runtime_error>("core", "VariableStruct::StructDefinition", "AddField",
                                          "struct definition already frozen");
    }
    if (type == DataType::None || type == DataType::Struct)
    {
        helper::Throw<std::invalid_argument>("core", "VariableStruct::StructDefinition", "AddField",
                                             "invalid data type");
    }
    if (offset + helper::GetDataTypeSize(type) * elementcount > m_StructSize)
    {
        helper::Throw<std::runtime_error>("core", "VariableStruct::StructDefinition", "AddField",
                                          "exceeded struct size");
    }
    m_Definition.emplace_back();
    auto &d = m_Definition.back();
    d.Name = name;
    d.Offset = offset;
    d.Type = type;
    d.ElementCount = elementcount;
}